

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O2

HighsInt __thiscall HEkk::computeFactor(HEkk *this)

{
  HighsSimplexAnalysis *this_00;
  HighsInt *pHVar1;
  bool assert_condition;
  HighsInt HVar2;
  allocator local_61;
  string local_60;
  string local_40;
  
  HVar2 = 0;
  if ((this->status_).has_fresh_invert == false) {
    clearBadBasisChange(this,kAll);
    assert_condition = lpFactorRowCompatible(this);
    std::__cxx11::string::string
              ((string *)&local_40,"HEkk::computeFactor: lpFactorRowCompatible",&local_61);
    highsAssert(assert_condition,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    this_00 = &this->analysis_;
    HighsSimplexAnalysis::simplexTimerStart(this_00,0x1b,0);
    HVar2 = HSimplexNla::invert(&this->simplex_nla_);
    HighsSimplexAnalysis::simplexTimerStop(this_00,0x1b,0);
    RefactorInfo::operator=
              (&(this->hot_start_).refactor_info,&(this->simplex_nla_).factor_.refactor_info_);
    std::vector<signed_char,_std::allocator<signed_char>_>::operator=
              (&(this->hot_start_).nonbasicMove,&(this->basis_).nonbasicMove_);
    (this->hot_start_).valid = true;
    if ((this->analysis_).analyse_factor_data == true) {
      HighsSimplexAnalysis::updateInvertFormData(this_00,&(this->simplex_nla_).factor_);
    }
    std::__cxx11::string::string((string *)&local_60,"HEkk::computeFactor - original",&local_61);
    debugNlaCheckInvert(this,&local_60,-(uint)(HVar2 == 0) | 2);
    std::__cxx11::string::~string((string *)&local_60);
    (this->status_).has_invert = HVar2 == 0;
    (this->status_).has_fresh_invert = HVar2 == 0;
    (this->info_).update_count = 0;
    pHVar1 = &(this->simplex_stats_).num_invert;
    *pHVar1 = *pHVar1 + 1;
  }
  return HVar2;
}

Assistant:

HighsInt HEkk::computeFactor() {
  assert(status_.has_nla);
  if (status_.has_fresh_invert) return 0;
  // Clear any bad basis changes
  clearBadBasisChange();
  highsAssert(lpFactorRowCompatible(),
              "HEkk::computeFactor: lpFactorRowCompatible");
  // Perform INVERT
  analysis_.simplexTimerStart(InvertClock);
  const HighsInt rank_deficiency = simplex_nla_.invert();
  analysis_.simplexTimerStop(InvertClock);
  //
  // Set up hot start information
  hot_start_.refactor_info = simplex_nla_.factor_.refactor_info_;
  hot_start_.nonbasicMove = basis_.nonbasicMove_;
  hot_start_.valid = true;

  if (analysis_.analyse_factor_data)
    analysis_.updateInvertFormData(simplex_nla_.factor_);

  HighsInt alt_debug_level = -1;
  if (rank_deficiency) alt_debug_level = kHighsDebugLevelCostly;
  debugNlaCheckInvert("HEkk::computeFactor - original", alt_debug_level);

  if (rank_deficiency) {
    // Have an invertible representation, but of B with column(s)
    // replacements due to singularity. So no (fresh) representation of
    // B^{-1}
    status_.has_invert = false;
    status_.has_fresh_invert = false;
  } else {
    // Now have a representation of B^{-1}, and it is fresh!
    status_.has_invert = true;
    status_.has_fresh_invert = true;
  }
  // Set the update count to zero since the corrected invertible
  // representation may be used for an initial basis. In any case the
  // number of updates shouldn't be positive
  info_.update_count = 0;

  simplex_stats_.num_invert++;
  return rank_deficiency;
}